

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Executor_Common.cpp
# Opt level: O0

uint ConvertFromAutoRef(uint target,uint source)

{
  ExternTypeInfo *pEVar1;
  uint local_14;
  uint source_local;
  uint target_local;
  
  local_14 = source;
  if (source != target) {
    do {
      pEVar1 = FastVector<ExternTypeInfo,_false,_false>::operator[]
                         ((FastVector<ExternTypeInfo,_false,_false> *)(NULLC::commonLinker + 0x200),
                          local_14);
      if (pEVar1->baseType == 0) {
        return 0;
      }
      pEVar1 = FastVector<ExternTypeInfo,_false,_false>::operator[]
                         ((FastVector<ExternTypeInfo,_false,_false> *)(NULLC::commonLinker + 0x200),
                          local_14);
      local_14 = pEVar1->baseType;
    } while (local_14 != target);
  }
  return 1;
}

Assistant:

unsigned ConvertFromAutoRef(unsigned int target, unsigned int source)
{
	if(source == target)
		return 1;
	while(NULLC::commonLinker->exTypes[source].baseType)
	{
		source = NULLC::commonLinker->exTypes[source].baseType;
		if(source == target)
			return 1;
	}
	return 0;
}